

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

DescriptorSetAllocation * __thiscall
Diligent::DescriptorSetAllocator::Allocate
          (DescriptorSetAllocation *__return_storage_ptr__,DescriptorSetAllocator *this,
          Uint64 CommandQueueMask,VkDescriptorSetLayout SetLayout,char *DebugName)

{
  undefined1 *puVar1;
  VulkanLogicalDevice *this_00;
  VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *rhs;
  DescriptorSetAllocation *pDVar2;
  int iVar3;
  VkDescriptorSet pVVar4;
  _Map_pointer ppVVar5;
  VkDescriptorPool pVVar6;
  _Elt_pointer pVVar7;
  _Elt_pointer pVVar8;
  string _msg;
  undefined1 local_88 [16];
  undefined1 local_78 [40];
  char *local_50;
  VkDescriptorSetLayout local_48;
  Uint64 local_40;
  DescriptorSetAllocation *local_38;
  
  local_78._24_8_ = &(this->super_DescriptorPoolManager).m_Mutex;
  local_78._32_8_ = SetLayout;
  local_50 = DebugName;
  local_40 = CommandQueueMask;
  local_38 = __return_storage_ptr__;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_78._24_8_);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pVVar8 = (this->super_DescriptorPoolManager).m_Pools.
           super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  this_00 = (((this->super_DescriptorPoolManager).m_DeviceVkImpl)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (pVVar8 != (this->super_DescriptorPoolManager).m_Pools.
                super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pVVar7 = (this->super_DescriptorPoolManager).m_Pools.
             super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppVVar5 = (this->super_DescriptorPoolManager).m_Pools.
              super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      local_78._0_8_ = pVVar8->m_VkObject;
      local_48 = (VkDescriptorSetLayout)local_78._32_8_;
      local_88._0_8_ = (element_type *)0x22;
      local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78._8_8_ = 1;
      local_78._16_8_ = &local_48;
      pVVar4 = VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
                         (this_00,(VkDescriptorSetAllocateInfo *)local_88,local_50);
      if (pVVar4 != (VkDescriptorSet)0x0) {
        pVVar6 = pVVar8->m_VkObject;
        rhs = (this->super_DescriptorPoolManager).m_Pools.
              super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (pVVar8 != rhs) {
          local_88._0_8_ =
               (pVVar8->m_pLogicalDevice).
               super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_88._8_8_ =
               (pVVar8->m_pLogicalDevice).
               super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          (pVVar8->m_pLogicalDevice).
          super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pVVar8->m_pLogicalDevice).
          super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_78._0_8_ = pVVar8->m_VkObject;
          pVVar8->m_VkObject = (VkDescriptorPool_T *)0x0;
          VulkanUtilities::
          VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
          operator=(pVVar8,rhs);
          VulkanUtilities::
          VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
          operator=(rhs,(VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
                         *)local_88);
          VulkanUtilities::
          VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
          ~VulkanObjectWrapper
                    ((VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>
                      *)local_88);
        }
        LOCK();
        puVar1 = &(this->super_DescriptorPoolManager).field_0xc4;
        *(int *)puVar1 = *(int *)puVar1 + 1;
        UNLOCK();
        goto LAB_00285b77;
      }
      pVVar8 = pVVar8 + 1;
      if (pVVar8 == pVVar7) {
        pVVar8 = ppVVar5[1];
        ppVVar5 = ppVVar5 + 1;
        pVVar7 = pVVar8 + 0x15;
      }
    } while (pVVar8 != (this->super_DescriptorPoolManager).m_Pools.
                       super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  FormatString<char[30]>((string *)local_88,(char (*) [30])"Allocated new descriptor pool");
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_88._0_8_,0,0,0);
  }
  if ((element_type *)local_88._0_8_ != (element_type *)local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  DescriptorPoolManager::CreateDescriptorPool
            ((DescriptorPoolWrapper *)local_88,&this->super_DescriptorPoolManager,"Descriptor pool")
  ;
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
  ::
  emplace_front<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
            ((deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
              *)&(this->super_DescriptorPoolManager).m_Pools,
             (VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *)
             local_88);
  VulkanUtilities::
  VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *)
             local_88);
  pVVar8 = (this->super_DescriptorPoolManager).m_Pools.
           super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78._0_8_ = pVVar8->m_VkObject;
  local_78._16_8_ = &local_48;
  local_48 = (VkDescriptorSetLayout)local_78._32_8_;
  local_88._0_8_ = (element_type *)0x22;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._8_8_ = 1;
  pVVar4 = VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
                     (this_00,(VkDescriptorSetAllocateInfo *)local_88,local_50);
  if (pVVar4 == (VkDescriptorSet)0x0) {
    FormatString<char[34]>((string *)local_88,(char (*) [34])"Failed to allocate descriptor set");
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0xe7);
    if ((element_type *)local_88._0_8_ != (element_type *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
  }
  LOCK();
  puVar1 = &(this->super_DescriptorPoolManager).field_0xc4;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  UNLOCK();
  pVVar6 = pVVar8->m_VkObject;
LAB_00285b77:
  pDVar2 = local_38;
  local_38->Set = pVVar4;
  local_38->Pool = pVVar6;
  local_38->CmdQueueMask = local_40;
  local_38->DescrSetAllocator = this;
  pthread_mutex_unlock((pthread_mutex_t *)local_78._24_8_);
  return pDVar2;
}

Assistant:

DescriptorSetAllocation DescriptorSetAllocator::Allocate(Uint64 CommandQueueMask, VkDescriptorSetLayout SetLayout, const char* DebugName)
{
    // Descriptor pools are externally synchronized, meaning that the application must not allocate
    // and/or free descriptor sets from the same pool in multiple threads simultaneously (13.2.3)
    std::lock_guard<std::mutex> Lock{m_Mutex};

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_DeviceVkImpl.GetLogicalDevice();
    // Try all pools starting from the frontmost
    for (auto it = m_Pools.begin(); it != m_Pools.end(); ++it)
    {
        VkDescriptorSet vkSet = AllocateDescriptorSet(LogicalDevice, *it, SetLayout, DebugName);
        if (vkSet != VK_NULL_HANDLE)
        {
            VkDescriptorPool vkPool = *it;
            // Move the pool to the front
            if (it != m_Pools.begin())
            {
                std::swap(*it, m_Pools.front());
            }

#ifdef DILIGENT_DEVELOPMENT
            ++m_AllocatedSetCounter;
#endif
            return {vkSet, vkPool, CommandQueueMask, *this};
        }
    }

    // Failed to allocate descriptor from existing pools -> create a new one
    LOG_INFO_MESSAGE("Allocated new descriptor pool");
    m_Pools.emplace_front(CreateDescriptorPool("Descriptor pool"));

    VulkanUtilities::DescriptorPoolWrapper& NewPool = m_Pools.front();
    VkDescriptorSet                         vkSet   = AllocateDescriptorSet(LogicalDevice, NewPool, SetLayout, DebugName);
    DEV_CHECK_ERR(vkSet != VK_NULL_HANDLE, "Failed to allocate descriptor set");

#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedSetCounter;
#endif

    return {vkSet, NewPool, CommandQueueMask, *this};
}